

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DG2Dot.h
# Opt level: O2

void __thiscall
dg::debug::DG2Dot<dg::LLVMNode>::dumpBB
          (DG2Dot<dg::LLVMNode> *this,BBlock<dg::LLVMNode> *BB,int indent)

{
  ofstream *os;
  ostream *poVar1;
  _List_node_base *p_Var2;
  Indent Ind;
  Indent local_3c;
  BBlock<dg::LLVMNode> *local_38;
  
  os = &this->out;
  local_3c.ind = indent;
  operator<<((ostream *)os,&local_3c);
  std::operator<<((ostream *)os,"/* Basic Block ");
  (**this->_vptr_DG2Dot)(this,os,BB->key);
  poVar1 = std::operator<<((ostream *)os," [");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,"] */\n");
  operator<<((ostream *)os,&local_3c);
  poVar1 = std::operator<<((ostream *)os,"subgraph cluster_bb_");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1," {\n");
  operator<<((ostream *)os,&local_3c);
  std::operator<<((ostream *)os,"\tstyle=filled fillcolor=white\n");
  operator<<((ostream *)os,&local_3c);
  std::operator<<((ostream *)os,"\tlabel=\"");
  (**this->_vptr_DG2Dot)(this,os,BB->key);
  poVar1 = std::operator<<((ostream *)os," [");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1,"]");
  if ((BB->analysisAuxData).dfsorder != 0) {
    operator<<((ostream *)os,&local_3c);
    poVar1 = std::operator<<((ostream *)os,"\\ndfs order: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  if (BB->slice_id != 0) {
    poVar1 = std::operator<<((ostream *)os,"\\nslice: ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::operator<<((ostream *)os,"\"\n");
  p_Var2 = (_List_node_base *)&BB->nodes;
  local_38 = BB;
  while (p_Var2 = (((_List_base<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)&p_Var2->_M_next)
                  ->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&BB->nodes) {
    operator<<((ostream *)os,&local_3c);
    poVar1 = std::operator<<((ostream *)os,"\tNODE");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    poVar1 = std::operator<<(poVar1," [shape=rect label=\"");
    poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
    std::operator<<(poVar1,"\"]\n");
  }
  operator<<((ostream *)os,&local_3c);
  poVar1 = std::operator<<((ostream *)os,"} /* cluster_bb_");
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::operator<<(poVar1," */\n\n");
  return;
}

Assistant:

void dumpBB(const BBlock<NodeT> *BB, int indent) {
        Indent Ind(indent);

        out << Ind << "/* Basic Block ";
        printKey(out, BB->getKey());
        out << " [" << BB << "] */\n";
        out << Ind << "subgraph cluster_bb_" << BB << " {\n";
        out << Ind << "\tstyle=filled fillcolor=white\n";
        out << Ind << "\tlabel=\"";

        printKey(out, BB->getKey());
        out << " [" << BB << "]";

        unsigned int dfsorder = BB->getDFSOrder();
        if (dfsorder != 0)
            out << Ind << "\\ndfs order: " << dfsorder;

        uint64_t slice_id = BB->getSlice();
        if (slice_id != 0)
            out << "\\nslice: " << slice_id;

        out << "\"\n";

        for (NodeT *n : BB->getNodes()) {
            // print nodes in BB, edges will be printed later
            out << Ind << "\tNODE" << n << " [shape=rect label=\""
                << n->getKey() << "\"]\n";
        }

        out << Ind << "} /* cluster_bb_" << BB << " */\n\n";
    }